

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool __thiscall
re2::PCRE::DoMatchImpl
          (PCRE *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n,int *vec,
          int vecsize)

{
  int iVar1;
  Arg *this_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int limit;
  int start;
  int i;
  int matches;
  int n_local;
  Arg **args_local;
  int *consumed_local;
  Anchor anchor_local;
  StringPiece *text_local;
  PCRE *this_local;
  
  if (vecsize < (n + 1) * 3) {
    __assert_fail("(1 + n) * 3 <= vecsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                  0x256,
                  "bool re2::PCRE::DoMatchImpl(const StringPiece &, Anchor, int *, const Arg *const *, int, int *, int) const"
                 );
  }
  iVar3 = TryMatch(this,text,0,anchor,true,vec,vecsize);
  if (-1 < iVar3) {
    if (iVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      *consumed = vec[1];
      if ((n == 0) || (args == (Arg **)0x0)) {
        this_local._7_1_ = true;
      }
      else {
        iVar3 = NumberOfCapturingGroups(this);
        if (iVar3 < n) {
          this_local._7_1_ = false;
        }
        else {
          for (limit = 0; limit < n; limit = limit + 1) {
            iVar3 = vec[(limit + 1) * 2];
            iVar1 = vec[(limit + 1) * 2 + 1];
            this_00 = args[limit];
            pcVar4 = StringPiece::data(text);
            bVar2 = Arg::Parse(this_00,pcVar4 + iVar3,iVar1 - iVar3);
            if (!bVar2) {
              return false;
            }
          }
          this_local._7_1_ = true;
        }
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("matches >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",600,
                "bool re2::PCRE::DoMatchImpl(const StringPiece &, Anchor, int *, const Arg *const *, int, int *, int) const"
               );
}

Assistant:

bool PCRE::DoMatchImpl(const StringPiece& text,
                     Anchor anchor,
                     int* consumed,
                     const Arg* const* args,
                     int n,
                     int* vec,
                     int vecsize) const {
  assert((1 + n) * 3 <= vecsize);  // results + PCRE workspace
  int matches = TryMatch(text, 0, anchor, true, vec, vecsize);
  assert(matches >= 0);  // TryMatch never returns negatives
  if (matches == 0)
    return false;

  *consumed = vec[1];

  if (n == 0 || args == NULL) {
    // We are not interested in results
    return true;
  }
  if (NumberOfCapturingGroups() < n) {
    // PCRE has fewer capturing groups than number of arg pointers passed in
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  // We do not need (can not do) any more checks on the value of 'matches' here
  // -- see the comment for TryMatch.
  for (int i = 0; i < n; i++) {
    const int start = vec[2*(i+1)];
    const int limit = vec[2*(i+1)+1];
    if (!args[i]->Parse(text.data() + start, limit-start)) {
      // TODO: Should we indicate what the error was?
      return false;
    }
  }

  return true;
}